

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldo.c
# Opt level: O2

int luaD_reallocstack(lua_State *L,int newsize,int raiseerror)

{
  lu_byte lVar1;
  long lVar2;
  UpVal *pUVar3;
  CallInfo *pCVar4;
  int iVar5;
  anon_union_16_2_5131162a_for_u *paVar6;
  CallInfo **ppCVar7;
  StkId pSVar8;
  lu_byte *plVar9;
  long lVar10;
  
  pSVar8 = (L->stack_last).p;
  lVar2 = (L->stack).offset;
  lVar1 = L->l_G->gcstopem;
  (L->top).p = (StkId)((long)(L->top).p - lVar2);
  (L->tbclist).p = (StkId)((long)(L->tbclist).p - lVar2);
  paVar6 = (anon_union_16_2_5131162a_for_u *)&L->openupval;
  while (pUVar3 = (paVar6->open).next, pUVar3 != (UpVal *)0x0) {
    (pUVar3->v).p = (TValue *)((long)(pUVar3->v).p - (L->stack).offset);
    paVar6 = &pUVar3->u;
  }
  ppCVar7 = &L->ci;
  while (pCVar4 = *ppCVar7, pCVar4 != (CallInfo *)0x0) {
    (pCVar4->top).p = (StkId)((long)(pCVar4->top).p - (L->stack).offset);
    (pCVar4->func).p = (StkId)((long)(pCVar4->func).p - (L->stack).offset);
    ppCVar7 = &pCVar4->previous;
  }
  L->l_G->gcstopem = '\x01';
  lVar10 = ((long)pSVar8 - lVar2) * 0x10000000 + 0x500000000 >> 0x20;
  lVar2 = (long)newsize + 5;
  pSVar8 = (StkId)luaM_realloc_(L,(L->stack).p,lVar10 * 0x10,lVar2 * 0x10);
  L->l_G->gcstopem = lVar1;
  if (pSVar8 == (StkId)0x0) {
    correctstack(L);
    iVar5 = 0;
    if (raiseerror != 0) {
      luaD_throw(L,4);
    }
  }
  else {
    (L->stack).p = pSVar8;
    correctstack(L);
    (L->stack_last).p = (L->stack).p + newsize;
    plVar9 = &(&pSVar8->val)[lVar10].tt_;
    iVar5 = 1;
    for (; lVar10 < lVar2; lVar10 = lVar10 + 1) {
      *plVar9 = '\0';
      plVar9 = plVar9 + 0x10;
    }
  }
  return iVar5;
}

Assistant:

int luaD_reallocstack (lua_State *L, int newsize, int raiseerror) {
  int oldsize = stacksize(L);
  int i;
  StkId newstack;
  int oldgcstop = G(L)->gcstopem;
  lua_assert(newsize <= LUAI_MAXSTACK || newsize == ERRORSTACKSIZE);
  relstack(L);  /* change pointers to offsets */
  G(L)->gcstopem = 1;  /* stop emergency collection */
  newstack = luaM_reallocvector(L, L->stack.p, oldsize + EXTRA_STACK,
                                   newsize + EXTRA_STACK, StackValue);
  G(L)->gcstopem = oldgcstop;  /* restore emergency collection */
  if (l_unlikely(newstack == NULL)) {  /* reallocation failed? */
    correctstack(L);  /* change offsets back to pointers */
    if (raiseerror)
      luaM_error(L);
    else return 0;  /* do not raise an error */
  }
  L->stack.p = newstack;
  correctstack(L);  /* change offsets back to pointers */
  L->stack_last.p = L->stack.p + newsize;
  for (i = oldsize + EXTRA_STACK; i < newsize + EXTRA_STACK; i++)
    setnilvalue(s2v(newstack + i)); /* erase new segment */
  return 1;
}